

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineComputer::ComputeFrameworkPath
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli,
          string *fwSearchFlag)

{
  bool bVar1;
  ulong uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference input;
  string local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  const_iterator fdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *fwDirs;
  string *fwSearchFlag_local;
  cmComputeLinkInformation *cli_local;
  cmLinkLineComputer *this_local;
  string *frameworkPath;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = cmComputeLinkInformation::GetFrameworkPaths_abi_cxx11_(cli);
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(this_00);
    while( true ) {
      local_58._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
      bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
      if (!bVar1) break;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)fwSearchFlag);
      input = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_50);
      ConvertToOutputFormat(&local_78,this,input);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ComputeFrameworkPath(
  cmComputeLinkInformation& cli, std::string const& fwSearchFlag)
{
  std::string frameworkPath;
  if (!fwSearchFlag.empty()) {
    std::vector<std::string> const& fwDirs = cli.GetFrameworkPaths();
    for (std::vector<std::string>::const_iterator fdi = fwDirs.begin();
         fdi != fwDirs.end(); ++fdi) {
      frameworkPath += fwSearchFlag;
      frameworkPath += this->ConvertToOutputFormat(*fdi);
      frameworkPath += " ";
    }
  }
  return frameworkPath;
}